

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_file.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  uint uVar5;
  byte bVar6;
  unsigned_long unaff_R15;
  BibTeXEntryVector e;
  ifstream in;
  vector<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_> local_278;
  unsigned_long local_260;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_258;
  undefined1 local_244 [4];
  char *local_240;
  char *local_238;
  bad_lexical_cast local_230;
  byte abStack_210 [488];
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"error: not enough arguments\n",0x1c);
    uVar5 = 1;
  }
  else {
    if (argc == 2) {
      bVar6 = 0;
    }
    else {
      local_260 = 0;
      local_238 = local_244;
      pcVar1 = argv[2];
      local_240 = pcVar1;
      sVar3 = strlen(pcVar1);
      local_258.finish = pcVar1 + sVar3;
      local_258.start = pcVar1;
      local_238 = local_258.finish;
      bVar2 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
              shr_unsigned<unsigned_long>(&local_258,&local_260);
      if (!bVar2) {
        local_230._0_8_ = &PTR__bad_cast_0011d9a8;
        local_230.source = (type_info_t *)&char*::typeinfo;
        local_230.target = (type_info_t *)&unsigned_long::typeinfo;
        boost::throw_exception<boost::bad_lexical_cast>(&local_230);
      }
      bVar6 = 1;
      unaff_R15 = local_260;
    }
    std::ifstream::ifstream(&local_230,argv[1],_S_in);
    if ((abStack_210[(long)*(undefined **)(local_230._0_8_ + 0xffffffffffffffe8)] & 5) == 0) {
      local_278.super__Vector_base<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_278.super__Vector_base<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_278.super__Vector_base<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar2 = bibtex::
              read<char,std::char_traits<char>,std::vector<bibtex::BibTeXEntry,std::allocator<bibtex::BibTeXEntry>>>
                        ((basic_istream<char,_std::char_traits<char>_> *)&local_230,&local_278);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"found ",6);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," entries\n",9);
      if ((bVar6 & bVar2) == 1) {
        bVar2 = ((long)local_278.
                       super__Vector_base<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_278.
                       super__Vector_base<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555 -
                unaff_R15 != 0;
      }
      else {
        bVar2 = !bVar2;
      }
      uVar5 = (uint)bVar2;
      std::vector<bibtex::BibTeXEntry,_std::allocator<bibtex::BibTeXEntry>_>::~vector(&local_278);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"error: could not open ",0x16);
      pcVar1 = argv[1];
      if (pcVar1 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x11f210);
      }
      else {
        sVar3 = strlen(pcVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar3);
      }
      uVar5 = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    }
    std::ifstream::~ifstream(&local_230);
  }
  return uVar5;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 2) {
        std::cerr << "error: not enough arguments\n";
        return EXIT_FAILURE;
    }

    using bibtex::BibTeXEntry;

    typedef std::vector<BibTeXEntry> BibTeXEntryVector;

    boost::optional<BibTeXEntryVector::size_type> expected;

    if (argc > 2) {
        try {
            expected = boost::lexical_cast<BibTeXEntryVector::size_type>
                (argv[2]);
        }
        catch (boost::bad_lexical_cast&) {
        }
    }

    std::ifstream in(argv[1]);

    if (!in) {
        std::cerr << "error: could not open " << argv[1] << "\n";
        return EXIT_FAILURE;
    }

    BibTeXEntryVector e;
    bool result = read(in, e);

    std::cout << "found " << e.size() << " entries\n";

    return result && (!expected || e.size() == *expected) ?
        EXIT_SUCCESS : EXIT_FAILURE;
}